

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOPofR.cpp
# Opt level: O3

void __thiscall
OpenMD::BOPofR::BOPofR
          (BOPofR *this,SimInfo *info,string *filename,string *sele,double rCut,uint nbins,
          RealType len)

{
  SelectionEvaluator *this_00;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  iterator __position;
  double dVar6;
  double __x;
  long *plVar7;
  ostream *poVar8;
  RealType *thrcof;
  mapped_type *pmVar9;
  vector<double,std::allocator<double>> *this_01;
  OpenMDBitSet *pOVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  RealType *__args;
  RealType m2M;
  RealType m2m;
  string paramString;
  pair<int,_int> lm;
  int error;
  stringstream params;
  uint local_254;
  double local_230;
  double local_228;
  string local_220;
  string *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_1f0;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_1e8;
  SelectionManager *local_1e0;
  double local_1d8;
  size_t local_1d0;
  key_type local_1c8;
  int local_1bc;
  undefined1 local_1b8 [16];
  OpenMDBitSet local_1a8 [2];
  ios_base local_138 [264];
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__BOPofR_00335dc0;
  local_200 = &this->selectionScript_;
  local_1f8 = &(this->selectionScript_).field_2;
  (this->selectionScript_)._M_dataplus._M_p = (pointer)local_1f8;
  pcVar2 = (sele->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_200,pcVar2,pcVar2 + sele->_M_string_length);
  local_1e0 = &this->seleMan_;
  SelectionManager::SelectionManager(local_1e0,info);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  local_1e8 = &this->m2Min;
  p_Var1 = &(this->m2Min)._M_t._M_impl.super__Rb_tree_header;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f0 = &this->m2Max;
  p_Var1 = &(this->m2Max)._M_t._M_impl.super__Rb_tree_header;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->w3j)._M_t._M_impl.super__Rb_tree_header;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->RCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->RCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->WofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->WofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->WofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->QofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->QofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->QofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getPrefix(&local_220,filename);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
  pOVar10 = (OpenMDBitSet *)(plVar7 + 2);
  if ((OpenMDBitSet *)*plVar7 == pOVar10) {
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p =
         (pOVar10->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._8_8_ = plVar7[3];
    local_1b8._0_8_ = local_1a8;
  }
  else {
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p =
         (pOVar10->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_1b8._0_8_ = (OpenMDBitSet *)*plVar7;
  }
  local_1b8._8_8_ = plVar7[1];
  *plVar7 = (long)pOVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((OpenMDBitSet *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)
                                    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  local_1b8._0_8_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Bond Order Parameter(r)","");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).analysisType_);
  if ((OpenMDBitSet *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)
                                    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_1b8,this_00);
    lVar11 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar11),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_1b8._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar11));
      lVar11 = lVar11 + 0x28;
    } while (lVar11 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_1b8);
  }
  this->rCut_ = rCut;
  this->len_ = len;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," rcut = ",8);
  poVar8 = std::ostream::_M_insert<double>(this->rCut_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", len = ",8);
  poVar8 = std::ostream::_M_insert<double>(this->len_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", nbins = ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).paramString_);
  uVar12 = (ulong)(this->super_StaticAnalyser).nBins_;
  this->deltaR_ = this->len_ / (double)uVar12;
  std::vector<int,_std::allocator<int>_>::resize(&this->RCount_,uVar12);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->WofR_,(ulong)(this->super_StaticAnalyser).nBins_);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->QofR_,(ulong)(this->super_StaticAnalyser).nBins_);
  if ((this->super_StaticAnalyser).nBins_ != 0) {
    piVar3 = (this->RCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->WofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->QofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      piVar3[uVar12] = 0;
      piVar4[uVar12] = 0;
      piVar5[uVar12] = 0;
      uVar12 = uVar12 + 1;
    } while (uVar12 < (this->super_StaticAnalyser).nBins_);
  }
  thrcof = (RealType *)operator_new__(0x68);
  local_254 = 1;
  uVar12 = 0;
  do {
    local_1d0 = uVar12 << 4 | 8;
    local_1d8 = (double)(int)uVar12;
    uVar13 = -(int)uVar12;
    do {
      local_1c8 = (key_type)((ulong)uVar13 << 0x20 | uVar12);
      memset(thrcof,0,local_1d0);
      MATPACK::Wigner3jm(local_1d8,local_1d8,local_1d8,(double)(int)uVar13,&local_228,&local_230,
                         thrcof,0xd,&local_1bc);
      dVar6 = local_228;
      pmVar9 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](local_1e8,&local_1c8);
      dVar6 = floor(dVar6);
      __x = local_230;
      *pmVar9 = (int)dVar6;
      pmVar9 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](local_1f0,&local_1c8);
      dVar6 = floor(__x);
      *pmVar9 = (int)dVar6;
      if (-1 < (int)(local_230 - local_228)) {
        lVar11 = -1;
        __args = thrcof;
        do {
          this_01 = (vector<double,std::allocator<double>> *)
                    std::
                    map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](&this->w3j,&local_1c8);
          __position._M_current = *(double **)(this_01 + 8);
          if (__position._M_current == *(double **)(this_01 + 0x10)) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      (this_01,__position,__args);
          }
          else {
            *__position._M_current = *__args;
            *(double **)(this_01 + 8) = __position._M_current + 1;
          }
          lVar11 = lVar11 + 1;
          __args = __args + 1;
        } while (lVar11 < (int)(local_230 - local_228));
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != local_254);
    uVar12 = uVar12 + 1;
    local_254 = local_254 + 1;
  } while (uVar12 != 7);
  operator_delete__(thrcof);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

BOPofR::BOPofR(SimInfo* info, const std::string& filename,
                 const std::string& sele, double rCut, unsigned int nbins,
                 RealType len) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), seleMan_(info), evaluator_(info) {
    setOutputName(getPrefix(filename) + ".bo");
    setAnalysisType("Bond Order Parameter(r)");

    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // Set up cutoff radius and order of the Legendre Polynomial:

    rCut_ = rCut;
    len_  = len;

    std::stringstream params;
    params << " rcut = " << rCut_ << ", len = " << len_
           << ", nbins = " << nBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    deltaR_ = len_ / nBins_;
    RCount_.resize(nBins_);
    WofR_.resize(nBins_);
    QofR_.resize(nBins_);

    for (unsigned int i = 0; i < nBins_; i++) {
      RCount_[i] = 0;
      WofR_[i]   = 0;
      QofR_[i]   = 0;
    }

    // Make arrays for Wigner3jm
    RealType* THRCOF = new RealType[2 * lMax_ + 1];
    // Variables for Wigner routine
    RealType lPass, m1Pass, m2m, m2M;
    int error, mSize;
    mSize = 2 * lMax_ + 1;

    for (int l = 0; l <= lMax_; l++) {
      lPass = (RealType)l;
      for (int m1 = -l; m1 <= l; m1++) {
        m1Pass = (RealType)m1;

        std::pair<int, int> lm = std::make_pair(l, m1);

        // Zero work array
        for (int ii = 0; ii < 2 * l + 1; ii++) {
          THRCOF[ii] = 0.0;
        }

        // Get Wigner coefficients
        Wigner3jm(lPass, lPass, lPass, m1Pass, m2m, m2M, THRCOF, mSize, error);

        m2Min[lm] = (int)floor(m2m);
        m2Max[lm] = (int)floor(m2M);

        for (int mmm = 0; mmm <= (int)(m2M - m2m); mmm++) {
          w3j[lm].push_back(THRCOF[mmm]);
        }
      }
    }

    delete[] THRCOF;
    THRCOF = NULL;
  }